

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMeshSurface.cpp
# Opt level: O3

void __thiscall chrono::fea::ChMeshSurface::AddFacesFromBoundary(ChMeshSurface *this)

{
  element_type *peVar1;
  ChLoadableUV CVar2;
  bool bVar3;
  ChLoadableUV CVar4;
  size_type sVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  pointer psVar7;
  size_type sVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  _func_int **pp_Var12;
  int iVar13;
  array<chrono::fea::ChNodeFEAxyz_*,_3UL> mface_key;
  ChTetrahedronFace mface;
  array<chrono::fea::ChNodeFEAxyz_*,_4UL> mface_key_2;
  multimap<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>_>
  face_map_hex;
  multimap<std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>_>_>
  face_map_tet;
  key_type local_198;
  undefined1 local_178 [4];
  int local_174;
  _func_int **local_170;
  undefined1 local_168 [16];
  undefined1 local_158 [48];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  ChMeshSurface *local_110;
  undefined1 local_108 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_100;
  ChLoadableUV CStack_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  _Rb_tree_node_base local_c0;
  size_t local_a0;
  ulong local_98;
  ChHexahedronFace *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  ChTetrahedronFace *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  undefined1 local_70 [16];
  _Rb_tree<std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>,_std::_Select1st<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>_>,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar7 = (this->mmesh->velements).
           super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_110 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (((long)(this->mmesh->velements).
             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 & 0xffffffff0U) != 0) {
    pp_Var12 = (_func_int **)0x0;
    do {
      peVar1 = psVar7[(long)pp_Var12].
               super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      CVar2 = (ChLoadableUV)
              psVar7[(long)pp_Var12].
              super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
      if (CVar2 != (ChLoadableUV)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
        }
      }
      if ((peVar1 != (element_type *)0x0) &&
         (CVar4 = (ChLoadableUV)
                  __dynamic_cast(peVar1,&ChElementBase::typeinfo,&ChElementTetrahedron::typeinfo,
                                 0xfffffffffffffffe), CVar4 != (ChLoadableUV)0x0)) {
        local_170 = pp_Var12;
        if (CVar2 != (ChLoadableUV)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CVar2);
        }
        iVar11 = 0;
        do {
          local_c0._M_parent = (_Base_ptr)CVar4;
          if (CVar2 == (ChLoadableUV)0x0) {
            local_c8 = (undefined1  [8])&PTR__ChTetrahedronFace_00b2a700;
            local_c0._M_color._0_1_ = (char)iVar11;
            local_c0._M_left = (_Base_ptr)0x0;
          }
          else {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
              UNLOCK();
              if (__libc_single_threaded != '\0') goto LAB_00637dcb;
              LOCK();
              *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
LAB_00637dcb:
              *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
            }
            local_c0._M_color._0_1_ = (char)iVar11;
            local_c8 = (undefined1  [8])&PTR__ChTetrahedronFace_00b2a700;
            local_c0._M_left = (_Base_ptr)CVar2;
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CVar2);
          }
          iVar13 = (int)local_c8;
          ChTetrahedronFace::GetNodeN((ChTetrahedronFace *)local_158,iVar13);
          local_198._M_elems[0] = (ChNodeFEAxyz *)local_158._0_8_;
          ChTetrahedronFace::GetNodeN((ChTetrahedronFace *)local_108,iVar13);
          local_198._M_elems[1] = (ChNodeFEAxyz *)local_108;
          ChTetrahedronFace::GetNodeN((ChTetrahedronFace *)local_168,iVar13);
          local_198._M_elems[2] = (ChNodeFEAxyz *)local_168._0_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
          }
          if ((ChLoadableUV)_Stack_100._M_pi != (ChLoadableUV)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_100._M_pi);
          }
          if ((ChLoadableUV)local_158._8_8_ != (ChLoadableUV)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
          }
          std::__insertion_sort<chrono::fea::ChNodeFEAxyz**,__gnu_cxx::__ops::_Iter_less_iter>
                    (&local_198,local_198._M_elems + 3);
          local_158._16_8_ = local_198._M_elems[2];
          local_158._0_8_ = local_198._M_elems[0];
          local_158._8_8_ = local_198._M_elems[1];
          local_158._24_8_ = &PTR__ChTetrahedronFace_00b2a700;
          local_158[0x20] = (undefined1)local_c0._M_color;
          local_158._40_8_ = local_c0._M_parent;
          _Stack_128._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_left;
          if ((ChLoadableUV)local_c0._M_left != (ChLoadableUV)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)((long)local_c0._M_left + 8) = *(int *)((long)local_c0._M_left + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)((long)local_c0._M_left + 8) = *(int *)((long)local_c0._M_left + 8) + 1;
            }
          }
          std::
          _Rb_tree<std::array<chrono::fea::ChNodeFEAxyz*,3ul>,std::pair<std::array<chrono::fea::ChNodeFEAxyz*,3ul>const,chrono::fea::ChTetrahedronFace>,std::_Select1st<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,3ul>const,chrono::fea::ChTetrahedronFace>>,std::less<std::array<chrono::fea::ChNodeFEAxyz*,3ul>>,std::allocator<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,3ul>const,chrono::fea::ChTetrahedronFace>>>
          ::
          _M_insert_equal<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,3ul>const,chrono::fea::ChTetrahedronFace>>
                    ((_Rb_tree<std::array<chrono::fea::ChNodeFEAxyz*,3ul>,std::pair<std::array<chrono::fea::ChNodeFEAxyz*,3ul>const,chrono::fea::ChTetrahedronFace>,std::_Select1st<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,3ul>const,chrono::fea::ChTetrahedronFace>>,std::less<std::array<chrono::fea::ChNodeFEAxyz*,3ul>>,std::allocator<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,3ul>const,chrono::fea::ChTetrahedronFace>>>
                      *)&local_60,
                     (pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>
                      *)local_158);
          local_158._24_8_ = &PTR__ChTetrahedronFace_00b2a700;
          if ((ChLoadableUV)_Stack_128._M_pi != (ChLoadableUV)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_128._M_pi);
          }
          local_c8 = (undefined1  [8])&PTR__ChTetrahedronFace_00b2a700;
          if ((ChLoadableUV)local_c0._M_left != (ChLoadableUV)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_left);
          }
          iVar11 = iVar11 + 1;
          pp_Var12 = local_170;
        } while (iVar11 != 4);
      }
      if (CVar2 != (ChLoadableUV)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CVar2);
      }
      pp_Var12 = (_func_int **)((long)pp_Var12 + 1);
      psVar7 = (local_110->mmesh->velements).
               super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar9 = (long)(local_110->mmesh->velements).
                    super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7;
    } while (pp_Var12 < (_func_int **)(uVar9 >> 4 & 0xffffffff));
    if ((uVar9 & 0xffffffff0) != 0) {
      uVar9 = 0;
      local_170 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2aa18;
      do {
        peVar1 = psVar7[uVar9].
                 super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        CVar2 = (ChLoadableUV)
                psVar7[uVar9].
                super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        if (CVar2 != (ChLoadableUV)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
          }
        }
        local_98 = uVar9;
        if ((peVar1 == (element_type *)0x0) ||
           (local_198._M_elems[0] =
                 (ChNodeFEAxyz *)
                 __dynamic_cast(peVar1,&ChElementBase::typeinfo,&ChElementTetrahedron::typeinfo,
                                0xfffffffffffffffe),
           (ChLoadableUV)local_198._M_elems[0] == (ChLoadableUV)0x0)) {
          local_198._M_elems[0] = (ChNodeFEAxyz *)0x0;
          local_198._M_elems[1] = (ChNodeFEAxyz *)0x0;
          if (CVar2 != (ChLoadableUV)0x0) goto LAB_00638020;
        }
        else {
          local_198._M_elems[1] = (ChNodeFEAxyz *)CVar2;
          if (CVar2 != (ChLoadableUV)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
            }
LAB_00638020:
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CVar2);
            if ((ChLoadableUV)local_198._M_elems[0] == (ChLoadableUV)0x0) goto LAB_0063824d;
          }
          local_e8._0_4_ = 0;
          do {
            if ((ChLoadableUV)local_198._M_elems[1] == (ChLoadableUV)0x0) {
              local_158._0_8_ = &PTR__ChTetrahedronFace_00b2a700;
              local_158[8] = (char)local_e8._0_4_;
              local_158._16_8_ = local_198._M_elems[0];
              local_158._24_8_ = (ChLoadableUV)0x0;
            }
            else {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((long)local_198._M_elems[1] + 8) =
                     *(int *)((long)local_198._M_elems[1] + 8) + 1;
                UNLOCK();
                if (__libc_single_threaded != '\0') goto LAB_006380b6;
                LOCK();
                *(int *)((long)local_198._M_elems[1] + 8) =
                     *(int *)((long)local_198._M_elems[1] + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((long)local_198._M_elems[1] + 8) =
                     *(int *)((long)local_198._M_elems[1] + 8) + 1;
LAB_006380b6:
                *(int *)((long)local_198._M_elems[1] + 8) =
                     *(int *)((long)local_198._M_elems[1] + 8) + 1;
              }
              local_158[8] = (char)local_e8._0_4_;
              local_158._24_8_ = local_198._M_elems[1];
              local_158._16_8_ = local_198._M_elems[0];
              local_158._0_8_ = &PTR__ChTetrahedronFace_00b2a700;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_elems[1]);
            }
            iVar11 = (int)local_158;
            ChTetrahedronFace::GetNodeN((ChTetrahedronFace *)local_108,iVar11);
            local_c8 = local_108;
            ChTetrahedronFace::GetNodeN((ChTetrahedronFace *)local_168,iVar11);
            local_c0._0_8_ = local_168._0_8_;
            ChTetrahedronFace::GetNodeN((ChTetrahedronFace *)local_d8,iVar11);
            local_c0._M_parent = (_Base_ptr)local_d8._0_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
            }
            if ((ChLoadableUV)_Stack_100._M_pi != (ChLoadableUV)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_100._M_pi);
            }
            std::__insertion_sort<chrono::fea::ChNodeFEAxyz**,__gnu_cxx::__ops::_Iter_less_iter>
                      ((key_type *)local_c8,&local_c0._M_left);
            sVar5 = std::
                    _Rb_tree<std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>,_std::_Select1st<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>_>,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>_>_>
                    ::count(&local_60,(key_type *)local_c8);
            if (sVar5 == 1) {
              p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x30);
              p_Var6->_M_use_count = 1;
              p_Var6->_M_weak_count = 1;
              p_Var6->_vptr__Sp_counted_base = local_170;
              __gnu_cxx::new_allocator<chrono::fea::ChTetrahedronFace>::
              construct<chrono::fea::ChTetrahedronFace,std::shared_ptr<chrono::fea::ChElementTetrahedron>&,int&>
                        ((new_allocator<chrono::fea::ChTetrahedronFace> *)local_108,
                         (ChTetrahedronFace *)(p_Var6 + 1),
                         (shared_ptr<chrono::fea::ChElementTetrahedron> *)&local_198,(int *)local_e8
                        );
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              }
              local_80 = (ChTetrahedronFace *)(p_Var6 + 1);
              local_78 = p_Var6;
              (*local_110->_vptr_ChMeshSurface[2])(local_110,&local_80);
              if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
              }
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
            }
            local_158._0_8_ = &PTR__ChTetrahedronFace_00b2a700;
            if ((ChLoadableUV)local_158._24_8_ != (ChLoadableUV)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._24_8_);
            }
            iVar11 = local_e8._0_4_ + 1;
            bVar3 = (int)local_e8._0_4_ < 3;
            local_e8._0_4_ = iVar11;
          } while (bVar3);
        }
LAB_0063824d:
        if ((ChLoadableUV)local_198._M_elems[1] != (ChLoadableUV)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_elems[1]);
        }
        uVar9 = local_98 + 1;
        psVar7 = (local_110->mmesh->velements).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar10 = (long)(local_110->mmesh->velements).
                       super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7;
      } while (uVar9 < (uVar10 >> 4 & 0xffffffff));
      local_c0._M_left = &local_c0;
      local_c0._0_8_ = local_c0._0_8_ & 0xffffffff00000000;
      local_c0._M_parent = (_Base_ptr)0x0;
      local_a0 = 0;
      local_c0._M_right = local_c0._M_left;
      if ((uVar10 & 0xffffffff0) != 0) {
        pp_Var12 = (_func_int **)0x0;
        do {
          peVar1 = psVar7[(long)pp_Var12].
                   super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          CVar2 = (ChLoadableUV)
                  psVar7[(long)pp_Var12].
                  super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
          if (CVar2 != (ChLoadableUV)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
            }
          }
          if ((peVar1 != (element_type *)0x0) &&
             (CVar4 = (ChLoadableUV)
                      __dynamic_cast(peVar1,&ChElementBase::typeinfo,&ChElementHexahedron::typeinfo,
                                     0xfffffffffffffffe), CVar4 != (ChLoadableUV)0x0)) {
            local_170 = pp_Var12;
            if (CVar2 != (ChLoadableUV)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
              }
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CVar2);
            }
            iVar11 = 0;
            do {
              local_198._M_elems[2] = (ChNodeFEAxyz *)CVar4;
              if (CVar2 == (ChLoadableUV)0x0) {
                local_198._M_elems[0] = (ChNodeFEAxyz *)&PTR__ChHexahedronFace_00b2a810;
                local_198._M_elems[1] =
                     (ChNodeFEAxyz *)CONCAT71(local_198._M_elems[1]._1_7_,(char)iVar11);
                local_198._M_elems[3] = (ChNodeFEAxyz *)0x0;
              }
              else {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
                  UNLOCK();
                  if (__libc_single_threaded != '\0') goto LAB_0063841f;
                  LOCK();
                  *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
LAB_0063841f:
                  *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
                }
                local_198._M_elems[1] =
                     (ChNodeFEAxyz *)CONCAT71(local_198._M_elems[1]._1_7_,(char)iVar11);
                local_198._M_elems[0] = (ChNodeFEAxyz *)&PTR__ChHexahedronFace_00b2a810;
                local_198._M_elems[3] = (ChNodeFEAxyz *)CVar2;
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CVar2);
              }
              iVar13 = (int)&local_198;
              ChHexahedronFace::GetNodeN((ChHexahedronFace *)local_158,iVar13);
              local_108 = (undefined1  [8])local_158._0_8_;
              ChHexahedronFace::GetNodeN((ChHexahedronFace *)local_168,iVar13);
              _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._0_8_;
              ChHexahedronFace::GetNodeN((ChHexahedronFace *)local_d8,iVar13);
              CStack_f8 = (ChLoadableUV)local_d8._0_8_;
              ChHexahedronFace::GetNodeN((ChHexahedronFace *)local_e8,iVar13);
              _Stack_f0._M_pi._4_4_ = local_e8._4_4_;
              _Stack_f0._M_pi._0_4_ = local_e8._0_4_;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
              }
              if ((ChLoadableUV)local_158._8_8_ != (ChLoadableUV)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
              }
              std::__insertion_sort<chrono::fea::ChNodeFEAxyz**,__gnu_cxx::__ops::_Iter_less_iter>
                        (local_108,local_e8);
              local_158._0_8_ = local_108;
              local_158._8_8_ = _Stack_100._M_pi;
              local_158._16_8_ = CStack_f8;
              local_158._24_8_ = _Stack_f0._M_pi;
              local_158._32_8_ = &PTR__ChHexahedronFace_00b2a810;
              local_158[0x28] = local_198._M_elems[1]._0_1_;
              _Stack_128._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_elems[2];
              local_120._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_elems[3];
              if ((ChLoadableUV)local_198._M_elems[3] != (ChLoadableUV)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)((long)local_198._M_elems[3] + 8) =
                       *(int *)((long)local_198._M_elems[3] + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(int *)((long)local_198._M_elems[3] + 8) =
                       *(int *)((long)local_198._M_elems[3] + 8) + 1;
                }
              }
              std::
              _Rb_tree<std::array<chrono::fea::ChNodeFEAxyz*,4ul>,std::pair<std::array<chrono::fea::ChNodeFEAxyz*,4ul>const,chrono::fea::ChHexahedronFace>,std::_Select1st<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,4ul>const,chrono::fea::ChHexahedronFace>>,std::less<std::array<chrono::fea::ChNodeFEAxyz*,4ul>>,std::allocator<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,4ul>const,chrono::fea::ChHexahedronFace>>>
              ::
              _M_insert_equal<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,4ul>const,chrono::fea::ChHexahedronFace>>
                        ((_Rb_tree<std::array<chrono::fea::ChNodeFEAxyz*,4ul>,std::pair<std::array<chrono::fea::ChNodeFEAxyz*,4ul>const,chrono::fea::ChHexahedronFace>,std::_Select1st<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,4ul>const,chrono::fea::ChHexahedronFace>>,std::less<std::array<chrono::fea::ChNodeFEAxyz*,4ul>>,std::allocator<std::pair<std::array<chrono::fea::ChNodeFEAxyz*,4ul>const,chrono::fea::ChHexahedronFace>>>
                          *)local_c8,
                         (pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>
                          *)local_158);
              local_158._32_8_ = &PTR__ChHexahedronFace_00b2a810;
              if ((ChNodeFEAxyz *)local_120._M_pi != (ChNodeFEAxyz *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
              }
              local_198._M_elems[0] = (ChNodeFEAxyz *)&PTR__ChHexahedronFace_00b2a810;
              if ((ChLoadableUV)local_198._M_elems[3] != (ChLoadableUV)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_elems[3]);
              }
              iVar11 = iVar11 + 1;
              pp_Var12 = local_170;
            } while (iVar11 != 6);
          }
          if (CVar2 != (ChLoadableUV)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CVar2);
          }
          pp_Var12 = (_func_int **)((long)pp_Var12 + 1);
          psVar7 = (local_110->mmesh->velements).
                   super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar9 = (long)(local_110->mmesh->velements).
                        super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7;
        } while (pp_Var12 < (_func_int **)(uVar9 >> 4 & 0xffffffff));
        if ((uVar9 & 0xffffffff0) != 0) {
          uVar9 = 0;
          local_170 = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2aa68;
          do {
            peVar1 = psVar7[uVar9].
                     super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            CVar2 = (ChLoadableUV)
                    psVar7[uVar9].
                    super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
            if (CVar2 != (ChLoadableUV)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
              }
            }
            local_98 = uVar9;
            if ((peVar1 == (element_type *)0x0) ||
               (local_108 = (undefined1  [8])
                            __dynamic_cast(peVar1,&ChElementBase::typeinfo,
                                           &ChElementHexahedron::typeinfo,0xfffffffffffffffe),
               (ChLoadableUV)local_108 == (ChLoadableUV)0x0)) {
              local_108 = (undefined1  [8])0x0;
              _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if (CVar2 != (ChLoadableUV)0x0) goto LAB_006386ac;
            }
            else {
              _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CVar2;
              if (CVar2 != (ChLoadableUV)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
                  UNLOCK();
                }
                else {
                  *(int *)((long)CVar2 + 8) = *(int *)((long)CVar2 + 8) + 1;
                }
LAB_006386ac:
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CVar2);
                if ((ChLoadableUV)local_108 == (ChLoadableUV)0x0) goto LAB_006388ff;
              }
              local_174 = 0;
              do {
                if ((ChLoadableUV)_Stack_100._M_pi == (ChLoadableUV)0x0) {
                  local_158._0_8_ = &PTR__ChHexahedronFace_00b2a810;
                  local_158[8] = (char)local_174;
                  local_158._16_8_ = local_108;
                  local_158._24_8_ = (ChLoadableUV)0x0;
                }
                else {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (_Stack_100._M_pi)->_M_use_count = (_Stack_100._M_pi)->_M_use_count + 1;
                    UNLOCK();
                    if (__libc_single_threaded != '\0') goto LAB_00638743;
                    LOCK();
                    (_Stack_100._M_pi)->_M_use_count = (_Stack_100._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (_Stack_100._M_pi)->_M_use_count = (_Stack_100._M_pi)->_M_use_count + 1;
LAB_00638743:
                    (_Stack_100._M_pi)->_M_use_count = (_Stack_100._M_pi)->_M_use_count + 1;
                  }
                  local_158[8] = (char)local_174;
                  local_158._24_8_ = _Stack_100._M_pi;
                  local_158._16_8_ = local_108;
                  local_158._0_8_ = &PTR__ChHexahedronFace_00b2a810;
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_100._M_pi);
                }
                iVar11 = (int)local_158;
                ChHexahedronFace::GetNodeN((ChHexahedronFace *)local_168,iVar11);
                local_198._M_elems[0] = (ChNodeFEAxyz *)local_168._0_8_;
                ChHexahedronFace::GetNodeN((ChHexahedronFace *)local_d8,iVar11);
                local_198._M_elems[1] = (ChNodeFEAxyz *)local_d8._0_8_;
                ChHexahedronFace::GetNodeN((ChHexahedronFace *)local_e8,iVar11);
                local_198._M_elems[2]._4_4_ = local_e8._4_4_;
                local_198._M_elems[2]._0_4_ = local_e8._0_4_;
                ChHexahedronFace::GetNodeN((ChHexahedronFace *)local_70,iVar11);
                local_198._M_elems[3] = (ChNodeFEAxyz *)local_70._0_8_;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
                }
                std::__insertion_sort<chrono::fea::ChNodeFEAxyz**,__gnu_cxx::__ops::_Iter_less_iter>
                          (&local_198,local_178);
                sVar8 = std::
                        _Rb_tree<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>,_std::_Select1st<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>_>
                        ::count((_Rb_tree<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>,_std::_Select1st<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>_>
                                 *)local_c8,&local_198);
                if (sVar8 == 1) {
                  p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x30);
                  p_Var6->_M_use_count = 1;
                  p_Var6->_M_weak_count = 1;
                  p_Var6->_vptr__Sp_counted_base = local_170;
                  __gnu_cxx::new_allocator<chrono::fea::ChHexahedronFace>::
                  construct<chrono::fea::ChHexahedronFace,std::shared_ptr<chrono::fea::ChElementHexahedron>&,int&>
                            ((new_allocator<chrono::fea::ChHexahedronFace> *)local_168,
                             (ChHexahedronFace *)(p_Var6 + 1),
                             (shared_ptr<chrono::fea::ChElementHexahedron> *)local_108,&local_174);
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                  }
                  local_90 = (ChHexahedronFace *)(p_Var6 + 1);
                  local_88 = p_Var6;
                  (*local_110->_vptr_ChMeshSurface[2])(local_110,&local_90);
                  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
                  }
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                }
                local_158._0_8_ = &PTR__ChHexahedronFace_00b2a810;
                if ((ChLoadableUV)local_158._24_8_ != (ChLoadableUV)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._24_8_);
                }
                iVar11 = local_174 + 1;
                bVar3 = local_174 < 5;
                local_174 = iVar11;
              } while (bVar3);
            }
LAB_006388ff:
            if ((ChLoadableUV)_Stack_100._M_pi != (ChLoadableUV)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_100._M_pi);
            }
            uVar9 = local_98 + 1;
            psVar7 = (local_110->mmesh->velements).
                     super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar9 < ((ulong)((long)(local_110->mmesh->velements).
                                          super__Vector_base<std::shared_ptr<chrono::fea::ChElementBase>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBase>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7)
                            >> 4 & 0xffffffff));
        }
      }
      goto LAB_006382c3;
    }
  }
  local_c0._M_left = &local_c0;
  local_c0._0_8_ = local_c0._0_8_ & 0xffffffff00000000;
  local_c0._M_parent = (_Base_ptr)0x0;
  local_a0 = 0;
  local_c0._M_right = local_c0._M_left;
LAB_006382c3:
  std::
  _Rb_tree<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>,_std::_Select1st<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>_>
  ::~_Rb_tree((_Rb_tree<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>,_std::_Select1st<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_4UL>,_chrono::fea::ChHexahedronFace>_>_>
               *)local_c8);
  std::
  _Rb_tree<std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>,_std::_Select1st<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>_>,_std::less<std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>_>,_std::allocator<std::pair<const_std::array<chrono::fea::ChNodeFEAxyz_*,_3UL>,_chrono::fea::ChTetrahedronFace>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void ChMeshSurface::AddFacesFromBoundary() {
    // Boundary faces of TETRAHEDRONS
    std::multimap<std::array<ChNodeFEAxyz*, 3>, ChTetrahedronFace> face_map_tet;

    for (unsigned int ie = 0; ie < this->mmesh->GetNelements(); ++ie) {
        if (auto mtetra = std::dynamic_pointer_cast<ChElementTetrahedron>(mmesh->GetElement(ie))) {
            for (int nface = 0; nface < 4; ++nface) {
                ChTetrahedronFace mface(mtetra, nface);
                std::array<ChNodeFEAxyz*, 3> mface_key = {mface.GetNodeN(0).get(), mface.GetNodeN(1).get(),
                                                          mface.GetNodeN(2).get()};
                std::sort(mface_key.begin(), mface_key.end());
                face_map_tet.insert({mface_key, mface});
            }
        }
    }
    for (unsigned int ie = 0; ie < this->mmesh->GetNelements(); ++ie) {
        if (auto mtetra = std::dynamic_pointer_cast<ChElementTetrahedron>(mmesh->GetElement(ie))) {
            for (int nface = 0; nface < 4; ++nface) {
                ChTetrahedronFace mface(mtetra, nface);
                std::array<ChNodeFEAxyz*, 3> mface_key = {mface.GetNodeN(0).get(), mface.GetNodeN(1).get(),
                                                          mface.GetNodeN(2).get()};
                std::sort(mface_key.begin(), mface_key.end());
                if (face_map_tet.count(mface_key) == 1) {
                    // Found a face that is not shared.. so it is a boundary face.
                    // Instance it to be handled via shared ptr, and add it to list...
                    auto boundary_face = chrono_types::make_shared<ChTetrahedronFace>(mtetra, nface);
                    this->AddFace(boundary_face);
                }
            }
        }
    }

    // Boundary faces of HEXAHEDRONS
    std::multimap<std::array<ChNodeFEAxyz*, 4>, ChHexahedronFace> face_map_hex;

    for (unsigned int ie = 0; ie < mmesh->GetNelements(); ++ie) {
        if (auto mbrick = std::dynamic_pointer_cast<ChElementHexahedron>(mmesh->GetElement(ie))) {
            for (int nface = 0; nface < 6; ++nface) {
                ChHexahedronFace mface(mbrick, nface);
                std::array<ChNodeFEAxyz*, 4> mface_key = {mface.GetNodeN(0).get(), mface.GetNodeN(1).get(),
                                                          mface.GetNodeN(2).get(), mface.GetNodeN(3).get()};
                std::sort(mface_key.begin(), mface_key.end());
                face_map_hex.insert({mface_key, mface});
            }
        }
    }
    for (unsigned int ie = 0; ie < mmesh->GetNelements(); ++ie) {
        if (auto mbrick = std::dynamic_pointer_cast<ChElementHexahedron>(mmesh->GetElement(ie))) {
            for (int nface = 0; nface < 6; ++nface) {
                ChHexahedronFace mface(mbrick, nface);
                std::array<ChNodeFEAxyz*, 4> mface_key = {mface.GetNodeN(0).get(), mface.GetNodeN(1).get(),
                                                          mface.GetNodeN(2).get(), mface.GetNodeN(3).get()};
                std::sort(mface_key.begin(), mface_key.end());
                if (face_map_hex.count(mface_key) == 1) {
                    // Found a face that is not shared.. so it is a boundary face.
                    // Instance it to be handled via shared ptr, and add it to list...
                    auto boundary_face = chrono_types::make_shared<ChHexahedronFace>(mbrick, nface);
                    this->AddFace(boundary_face);
                }
            }
        }
    }
}